

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O1

void dump_CSTK(int before)

{
  DLword *pDVar1;
  DLword *pDVar2;
  DLword *pDVar3;
  
  pDVar1 = MachineState.csp;
  if (before != 0) {
    pDVar2 = MachineState.csp + -(long)before;
    pDVar3 = pDVar2;
    do {
      if (((ulong)pDVar1 & 1) != 0) {
        printf("Misaligned pointer in LAddrFromNative %p\n",pDVar3);
      }
      printf("\n%x : %x ",(ulong)((long)pDVar2 - (long)Lisp_world) >> 1,
             (ulong)*(ushort *)((ulong)pDVar2 ^ 2));
      pDVar3 = pDVar3 + 1;
      pDVar2 = pDVar2 + 1;
    } while (pDVar3 != MachineState.csp);
  }
  pDVar1 = MachineState.csp;
  if (((ulong)MachineState.csp & 1) != 0) {
    printf("Misaligned pointer in LAddrFromNative %p\n",MachineState.csp);
  }
  printf("\nCurrentSTKP : %x  ",(ulong)((long)pDVar1 - (long)Lisp_world) >> 1 & 0xffffffff);
  printf("\ncontents :  %x ",(ulong)*(uint *)(MachineState.csp + -1));
  return;
}

Assistant:

void dump_CSTK(int before) {
  DLword *ptr;
  ptr = CurrentStackPTR - before;
  while (ptr != CurrentStackPTR) {
    printf("\n%x : %x ", LAddrFromNative(ptr), GETWORD(ptr));
    ptr++;
  }
  printf("\nCurrentSTKP : %x  ", LAddrFromNative(CurrentStackPTR));
  printf("\ncontents :  %x ", *((LispPTR *)(CurrentStackPTR - 1)));
}